

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O0

QFont * QApplication::font(char *className)

{
  bool bVar1;
  const_iterator *o;
  qsizetype qVar2;
  QFont *pQVar3;
  char *in_RSI;
  QFont *in_RDI;
  long in_FS_OFFSET;
  FontHash *hash;
  ConstIterator it;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_app_fonts>_>
  *in_stack_ffffffffffffff88;
  QFont *this;
  QByteArray local_30;
  piter local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this = in_RDI;
  o = (const_iterator *)
      QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_app_fonts>_>::operator()
                (in_stack_ffffffffffffff88);
  if (((in_RSI != (char *)0x0) && (o != (const_iterator *)0x0)) &&
     (qVar2 = QHash<QByteArray,_QFont>::size((QHash<QByteArray,_QFont> *)o), qVar2 != 0)) {
    local_18.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
    local_18.d = (Data<QHashPrivate::Node<QByteArray,_QFont>_> *)&DAT_aaaaaaaaaaaaaaaa;
    QByteArray::QByteArray(&local_30,in_RSI,-1);
    local_18 = (piter)QHash<QByteArray,_QFont>::constFind
                                ((QHash<QByteArray,_QFont> *)o,
                                 (QByteArray *)in_stack_ffffffffffffff88);
    QByteArray::~QByteArray((QByteArray *)0x2cbe55);
    QHash<QByteArray,_QFont>::constEnd((QHash<QByteArray,_QFont> *)this);
    bVar1 = QHash<QByteArray,_QFont>::const_iterator::operator!=((const_iterator *)this,o);
    if (bVar1) {
      pQVar3 = QHash<QByteArray,_QFont>::const_iterator::operator*((const_iterator *)0x2cbe88);
      QFont::QFont(this,pQVar3);
      goto LAB_002cbea3;
    }
  }
  font();
LAB_002cbea3:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QFont QApplication::font(const char *className)
{
    FontHash *hash = app_fonts();
    if (className && hash && hash->size()) {
        QHash<QByteArray, QFont>::ConstIterator it = hash->constFind(className);
        if (it != hash->constEnd())
            return *it;
    }
    return font();
}